

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O1

void __thiscall
axl::sl::
ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
::release(ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
          *this)

{
  int32_t *piVar1;
  Hdr *pHVar2;
  FreeFunc *pFVar3;
  
  pHVar2 = this->m_hdr;
  if (pHVar2 != (Hdr *)0x0) {
    LOCK();
    piVar1 = &(pHVar2->super_BufHdr).super_RefCount.m_refCount;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**(pHVar2->super_BufHdr).super_RefCount._vptr_RefCount)(pHVar2);
      LOCK();
      piVar1 = &(pHVar2->super_BufHdr).super_RefCount.m_weakRefCount;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) &&
         (pFVar3 = (pHVar2->super_BufHdr).super_RefCount.m_freeFunc, pFVar3 != (FreeFunc *)0x0)) {
        (*pFVar3)(pHVar2);
      }
    }
  }
  this->m_p = (AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
               *)0x0;
  this->m_hdr = (Hdr *)0x0;
  this->m_count = 0;
  return;
}

Assistant:

void
	release() {
		if (m_hdr)
			m_hdr->release();

		initialize();
	}